

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O3

ZCC_OpProto * __thiscall
ZCC_OpInfoType::FindBestProto
          (ZCC_OpInfoType *this,PType *left,Conversion **route1,int *numslots1,PType *right,
          Conversion **route2,int *numslots2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Conversion **slots;
  Conversion **slots_00;
  ZCC_OpProto *pZVar7;
  Conversion *routes [2] [2] [8];
  uint local_188;
  uint local_184;
  Conversion **local_180;
  Conversion **local_178;
  ulong local_170;
  ZCC_OpProto *local_168;
  Conversion *apCStack_138 [16];
  Conversion *local_b8 [17];
  
  if ((left != (PType *)0x0) && (right != (PType *)0x0)) {
    pZVar7 = this->Protos;
    local_170 = 0;
    if (pZVar7 == (ZCC_OpProto *)0x0) {
      local_168 = (ZCC_OpProto *)0x0;
    }
    else {
      uVar5 = 0x7fffffff;
      local_180 = (Conversion **)0x0;
      local_178 = (Conversion **)0x0;
      local_168 = (ZCC_OpProto *)0x0;
      local_184 = 0x7fffffff;
      local_188 = 0x7fffffff;
      uVar6 = 0;
      do {
        if (pZVar7->Type2 != (PType *)0x0) {
          slots_00 = apCStack_138 + local_170 * 8;
          uVar1 = PType::FindConversion(left,pZVar7->Type1,slots_00,8);
          slots = local_b8 + (ulong)uVar6 * 8;
          uVar2 = PType::FindConversion(right,pZVar7->Type2,slots,8);
          if (-1 < (int)(uVar2 | uVar1)) {
            uVar3 = 0;
            uVar4 = 0;
            if (0 < (int)uVar1) {
              uVar4 = uVar1 - ((*slots_00)->ConvertConstant == FtoD);
            }
            if (0 < (int)uVar2) {
              uVar3 = uVar2 - ((*slots)->ConvertConstant == FtoD);
            }
            if (uVar4 < uVar3) {
              uVar3 = uVar4;
            }
            if ((int)uVar3 < (int)uVar5) {
              local_170 = (ulong)((uint)local_170 ^ 1);
              uVar6 = uVar6 ^ 1;
              uVar5 = uVar3;
              local_188 = uVar1;
              local_184 = uVar2;
              local_180 = slots_00;
              local_178 = slots;
              local_168 = pZVar7;
            }
          }
        }
      } while ((uVar5 != 0) && (pZVar7 = pZVar7->Next, pZVar7 != (ZCC_OpProto *)0x0));
      if ((route1 != (Conversion **)0x0) &&
         ((local_180 != (Conversion **)0x0 && (uVar5 = *numslots1, 0 < (int)uVar5)))) {
        if ((int)local_188 <= (int)uVar5) {
          uVar5 = local_188;
        }
        *numslots1 = uVar5;
        if (0 < (int)local_188) {
          memcpy(route1,local_180,(ulong)uVar5 << 3);
        }
      }
      if (((route2 != (Conversion **)0x0) && (local_178 != (Conversion **)0x0)) &&
         (uVar5 = *numslots2, 0 < (int)uVar5)) {
        if ((int)local_184 <= (int)uVar5) {
          uVar5 = local_184;
        }
        *numslots2 = uVar5;
        if (0 < (int)local_184) {
          memcpy(route2,local_178,(ulong)uVar5 << 3);
        }
      }
    }
    return local_168;
  }
  __assert_fail("left != NULL && right != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_expr.cpp"
                ,0xad,
                "ZCC_OpProto *ZCC_OpInfoType::FindBestProto(PType *, const PType::Conversion **, int &, PType *, const PType::Conversion **, int &)"
               );
}

Assistant:

ZCC_OpProto *ZCC_OpInfoType::FindBestProto(
	PType *left, const PType::Conversion **route1, int &numslots1,
	PType *right, const PType::Conversion **route2, int &numslots2)
{
	assert(left != NULL && right != NULL);

	const PType::Conversion *routes[2][2][CONVERSION_ROUTE_SIZE];
	const PType::Conversion **best_route1 = NULL, **best_route2 = NULL;
	int cur_route1 = 0, cur_route2 = 0;
	int best_dist1 = INT_MAX, best_dist2 = INT_MAX;

	ZCC_OpProto *best_proto = NULL;
	int best_low_dist = INT_MAX;

	for (ZCC_OpProto *proto = Protos; best_low_dist != 0 && proto != NULL; proto = proto->Next)
	{
		if (proto->Type2 == NULL)
		{ // Not a binary prototype
			continue;
		}
		int dist1 = left->FindConversion(proto->Type1, routes[0][cur_route1], CONVERSION_ROUTE_SIZE);
		int dist2 = right->FindConversion(proto->Type2, routes[1][cur_route2], CONVERSION_ROUTE_SIZE);
		if (dist1 < 0 || dist2 < 0)
		{ // one or both operator types are unreachable
			continue;
		}
		// Do not count F32->F64 conversions in the distance comparisons. If we do, then
		// [[float32 (op) int]] will choose the integer version instead of the floating point
		// version, which we do not want.
		int test_dist1 = dist1, test_dist2 = dist2;
		if (test_dist1 > 0 && routes[0][cur_route1][0]->ConvertConstant == FtoD)
		{
			test_dist1--;
		}
		if (test_dist2 > 0 && routes[1][cur_route2][0]->ConvertConstant == FtoD)
		{
			test_dist2--;
		}
		int dist = MIN(test_dist1, test_dist2);
		if (dist < best_low_dist)
		{
			best_low_dist = dist;
			best_proto = proto;
			best_dist1 = dist1;
			best_dist2 = dist2;
			best_route1 = routes[0][cur_route1];
			best_route2 = routes[1][cur_route2];
			cur_route1 ^= 1;
			cur_route2 ^= 1;
		}
	}
	// Copy best conversion route to the caller's arrays.
	if (best_route1 != NULL && route1 != NULL && numslots1 > 0)
	{
		numslots1 = MIN(numslots1, best_dist1);
		if (numslots1 > 0)
		{
			memcpy(route1, best_route1, sizeof(*route1) * numslots1);
		}
	}
	if (best_route2 != NULL && route2 != NULL && numslots2 > 0)
	{
		numslots2 = MIN(numslots2, best_dist2);
		if (numslots2 > 0)
		{
			memcpy(route2, best_route2, sizeof(*route2) * numslots2);
		}
	}
	return best_proto;
}